

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PartialDistribution.hpp
# Opt level: O3

void __thiscall
njoy::ENDFtk::section::Type<15>::PartialDistribution::~PartialDistribution
          (PartialDistribution *this)

{
  pointer plVar1;
  pointer pdVar2;
  
  std::
  vector<njoy::ENDFtk::section::Type<15>::TabulatedSpectrum::OutgoingEnergyDistribution,_std::allocator<njoy::ENDFtk::section::Type<15>::TabulatedSpectrum::OutgoingEnergyDistribution>_>
  ::~vector(&(this->distribution_).data_.sequence_);
  plVar1 = (this->distribution_).data_.interpolation_.super_InterpolationBase.
           interpolationSchemeIndices.super__Vector_base<long,_std::allocator<long>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (plVar1 != (pointer)0x0) {
    operator_delete(plVar1,(long)*(pointer *)
                                  ((long)&(this->distribution_).data_.interpolation_.
                                          super_InterpolationBase.interpolationSchemeIndices.
                                          super__Vector_base<long,_std::allocator<long>_>._M_impl +
                                  0x10) - (long)plVar1);
  }
  plVar1 = (this->distribution_).data_.interpolation_.super_InterpolationBase.boundaryIndices.
           super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start;
  if (plVar1 != (pointer)0x0) {
    operator_delete(plVar1,(long)*(pointer *)
                                  ((long)&(this->distribution_).data_.interpolation_.
                                          super_InterpolationBase.boundaryIndices.
                                          super__Vector_base<long,_std::allocator<long>_>._M_impl +
                                  0x10) - (long)plVar1);
  }
  pdVar2 = (this->probability_).super_TabulationRecord.yValues.
           super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_start;
  if (pdVar2 != (pointer)0x0) {
    operator_delete(pdVar2,(long)(this->probability_).super_TabulationRecord.yValues.
                                 super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage - (long)pdVar2);
  }
  pdVar2 = (this->probability_).super_TabulationRecord.xValues.
           super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_start;
  if (pdVar2 != (pointer)0x0) {
    operator_delete(pdVar2,(long)(this->probability_).super_TabulationRecord.xValues.
                                 super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage - (long)pdVar2);
  }
  plVar1 = (this->probability_).super_TabulationRecord.super_InterpolationBase.
           interpolationSchemeIndices.super__Vector_base<long,_std::allocator<long>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (plVar1 != (pointer)0x0) {
    operator_delete(plVar1,(long)*(pointer *)
                                  ((long)&(this->probability_).super_TabulationRecord.
                                          super_InterpolationBase.interpolationSchemeIndices.
                                          super__Vector_base<long,_std::allocator<long>_>._M_impl.
                                          super__Vector_impl_data + 0x10) - (long)plVar1);
  }
  plVar1 = (this->probability_).super_TabulationRecord.super_InterpolationBase.boundaryIndices.
           super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start;
  if (plVar1 != (pointer)0x0) {
    operator_delete(plVar1,(long)*(pointer *)
                                  ((long)&(this->probability_).super_TabulationRecord.
                                          super_InterpolationBase.boundaryIndices.
                                          super__Vector_base<long,_std::allocator<long>_>._M_impl.
                                          super__Vector_impl_data + 0x10) - (long)plVar1);
    return;
  }
  return;
}

Assistant:

class ENDFTK_PYTHON_EXPORT PartialDistribution {

  Probability probability_;
  Distribution distribution_;

  /* auxiliary functions */
  #include "ENDFtk/section/15/PartialDistribution/src/verifyLF.hpp"
  #include "ENDFtk/section/15/PartialDistribution/src/readPartialDistribution.hpp"

public:

  /* constructor */
  #include "ENDFtk/section/15/PartialDistribution/src/ctor.hpp"

  /* get methods */

  /**
   *  @brief Return the probability
   */
  const Probability& probability() const { return this->probability_; }

  /**
   *  @brief Return the distribution
   */
  const Distribution& distribution() const { return this->distribution_; }

  #include "ENDFtk/section/15/PartialDistribution/src/NC.hpp"
  #include "ENDFtk/section/15/PartialDistribution/src/print.hpp"
}